

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmapReader.h
# Opt level: O2

void __thiscall MmapReader::~MmapReader(MmapReader *this)

{
  (this->super_MemoryReader).super_ReadWriter._vptr_ReadWriter =
       (_func_int **)&PTR__MmapReader_001422d0;
  if ((this->super_MemoryReader).super_ReadWriter._readonly == false) {
    file_helper::truncate(&this->_help,(char *)&this->_filename,(this->super_MemoryReader)._size);
  }
  boost::interprocess::mapped_region::~mapped_region(&this->_region);
  boost::interprocess::file_mapping::~file_mapping(&this->_file);
  file_helper::~file_helper(&this->_help);
  std::__cxx11::string::~string((string *)&this->_filename);
  return;
}

Assistant:

virtual ~MmapReader()
    {
        if (!isreadonly())
            _help.truncate(_filename, size());
    }